

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O0

shared_ptr<SchemeObject>
make_function(string *name,
             list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l,
             Context *context,string *form)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  string *psVar1;
  bool bVar2;
  size_type sVar3;
  __shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  eval_error *peVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  shared_ptr<SchemeObject> sVar8;
  _Self local_190;
  _List_node_base *local_188;
  _Self local_180;
  _List_const_iterator<std::shared_ptr<ASTNode>_> i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  __shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_b0;
  shared_ptr<ASTNode> *i;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *__range1;
  undefined1 local_88 [4];
  int state;
  shared_ptr<SchemeCompoundProcedure> f;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> pl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *form_local;
  Context *context_local;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l_local;
  string *name_local;
  
  local_30 = in_R8;
  form_local = form;
  context_local = context;
  l_local = l;
  name_local = name;
  sVar3 = std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
          size((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)context
              );
  if (1 < sVar3) {
    p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::__cxx11::
             list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::front
                       ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                         *)context_local);
    peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var4);
    if (peVar5->type == LIST) {
      p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::__cxx11::
               list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::front
                         ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                           *)context_local);
      peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
                ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&peVar5->list);
      bVar2 = std::operator==(local_30,"define");
      if ((bVar2) || (bVar2 = std::operator==(local_30,"named-lambda"), bVar2)) {
        std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
        pop_front((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                  &f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
      }
      std::make_shared<SchemeCompoundProcedure,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      __range1._4_4_ = 0;
      this = &f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      __end1 = std::__cxx11::
               list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::begin
                         ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                           *)this);
      i = (shared_ptr<ASTNode> *)
          std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
          end((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)this);
      do {
        bVar2 = std::operator!=(&__end1,(_Self *)&i);
        if (!bVar2) {
          if (__range1._4_4_ != 2) {
            local_188 = (_List_node_base *)
                        std::__cxx11::
                        list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
                        begin((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                               *)context_local);
            local_180._M_node =
                 (_List_node_base *)
                 std::next<std::_List_const_iterator<std::shared_ptr<ASTNode>>>
                           ((_List_const_iterator<std::shared_ptr<ASTNode>_>)local_188,1);
            while( true ) {
              local_190._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::end
                             ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                               *)context_local);
              bVar2 = std::operator!=(&local_180,&local_190);
              psVar1 = form_local;
              if (!bVar2) break;
              peVar7 = std::
                       __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_88);
              p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::_List_const_iterator<std::shared_ptr<ASTNode>_>::operator*(&local_180);
              peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator*(p_Var4);
              std::__cxx11::list<ASTNode,_std::allocator<ASTNode>_>::push_back(&peVar7->body,peVar5)
              ;
              std::_List_const_iterator<std::shared_ptr<ASTNode>_>::operator++(&local_180);
            }
            peVar7 = std::
                     __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_88);
            Context::operator=(&peVar7->context,(Context *)psVar1);
            std::shared_ptr<SchemeObject>::shared_ptr<SchemeCompoundProcedure,void>
                      ((shared_ptr<SchemeObject> *)name,
                       (shared_ptr<SchemeCompoundProcedure> *)local_88);
            std::shared_ptr<SchemeCompoundProcedure>::~shared_ptr
                      ((shared_ptr<SchemeCompoundProcedure> *)local_88);
            std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
            ::~list((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                    &f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
            sVar8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 extraout_RDX._M_pi;
            sVar8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)name;
            return (shared_ptr<SchemeObject>)
                   sVar8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
          }
          i_1._M_node._7_1_ = 1;
          peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_170,local_30,": invalid declaration");
          eval_error::runtime_error(peVar6,&local_170);
          i_1._M_node._7_1_ = 0;
          __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
        }
        local_b0 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::_List_iterator<std::shared_ptr<ASTNode>_>::operator*(&__end1);
        peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_b0);
        if (peVar5->type != NAME) {
          local_d1 = 1;
          peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_d0,local_30,": list of names required");
          eval_error::runtime_error(peVar6,&local_d0);
          local_d1 = 0;
          __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
        }
        peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_b0);
        bVar2 = std::operator==(&peVar5->value,"#!optional");
        if (bVar2) {
          if (__range1._4_4_ != 0) {
            local_f9 = 1;
            peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_f8,local_30,": invalid declaration");
            eval_error::runtime_error(peVar6,&local_f8);
            local_f9 = 0;
            __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
          }
          __range1._4_4_ = 1;
        }
        else {
          peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_b0);
          bVar2 = std::operator==(&peVar5->value,"#!rest");
          if (!bVar2) {
            peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(local_b0);
            bVar2 = std::operator==(&peVar5->value,".");
            if (!bVar2) {
              peVar7 = std::
                       __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_88);
              peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(local_b0);
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&peVar7->params,&peVar5->value);
              if (__range1._4_4_ == 0) {
                peVar7 = std::
                         __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_88);
                (peVar7->super_SchemeProcedure).arity.first =
                     (peVar7->super_SchemeProcedure).arity.first + 1;
                peVar7 = std::
                         __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_88);
                (peVar7->super_SchemeProcedure).arity.second =
                     (peVar7->super_SchemeProcedure).arity.second + 1;
              }
              else if (__range1._4_4_ == 1) {
                peVar7 = std::
                         __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_88);
                (peVar7->super_SchemeProcedure).arity.second =
                     (peVar7->super_SchemeProcedure).arity.second + 1;
              }
              else {
                if (__range1._4_4_ != 2) {
                  local_149 = 1;
                  peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&local_148,local_30,": invalid declaration");
                  eval_error::runtime_error(peVar6,&local_148);
                  local_149 = 0;
                  __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
                }
                __range1._4_4_ = 3;
              }
              goto LAB_001612e9;
            }
          }
          if (1 < __range1._4_4_) {
            local_121 = 1;
            peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_120,local_30,": invalid declaration");
            eval_error::runtime_error(peVar6,&local_120);
            local_121 = 0;
            __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
          }
          __range1._4_4_ = 2;
          peVar7 = std::
                   __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_88);
          (peVar7->super_SchemeProcedure).arity.second = -1;
        }
LAB_001612e9:
        std::_List_iterator<std::shared_ptr<ASTNode>_>::operator++(&__end1);
      } while( true );
    }
  }
  peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,local_30,": parameters and code required");
  eval_error::runtime_error(peVar6,&local_50);
  __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
}

Assistant:

static std::shared_ptr<SchemeObject>
make_function(const std::string &name, const std::list<std::shared_ptr<ASTNode>> &l, const Context &context,
              const std::string &form)
{
    if(l.size() < 2 || l.front()->type != ast_type_t::LIST)
        throw eval_error(form + ": parameters and code required");
    auto pl = l.front()->list;
    if(form == "define" || form == "named-lambda")
        pl.pop_front();
    auto f = std::make_shared<SchemeCompoundProcedure>(name);
    int state = 0;
    for(const auto &i : pl)
    {
        if(i->type != ast_type_t::NAME)
            throw eval_error(form + ": list of names required");
        if(i->value == "#!optional")
        {
            if(state != 0)
                throw eval_error(form + ": invalid declaration");
            state = 1;
        }
        else if(i->value == "#!rest" || i->value == ".")
        {
            if(state > 1)
                throw eval_error(form + ": invalid declaration");
            state = 2;
            f->arity.second = -1;
        }
        else
        {
            f->params.push_back(i->value);
            if(state == 0)
            {
                ++f->arity.first;
                ++f->arity.second;
            }
            else if(state == 1)
            {
                ++f->arity.second;
            }
            else if(state == 2)
            {
                state = 3;
            }
            else
                throw eval_error(form + ": invalid declaration");
        }
    }
    if(state == 2)
        throw eval_error(form + ": invalid declaration");
    for(auto i = next(l.begin()); i != l.end(); ++i)
    {
        f->body.push_back(**i);
    }
    f->context = context;
    return f;
}